

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int arkResize(ARKodeMem ark_mem,N_Vector y0,realtype hscale,realtype t0,ARKVecResizeFn resize,
             void *resize_data)

{
  int iVar1;
  int lrw_diff;
  char *msgfmt;
  int liw_diff;
  double dVar2;
  sunindextype liw1;
  sunindextype lrw1;
  sunindextype local_38;
  sunindextype local_34;
  
  if (ark_mem == (ARKodeMem)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    ark_mem = (ARKodeMem)0x0;
    iVar1 = -0x15;
  }
  else if (ark_mem->MallocDone == 0) {
    msgfmt = "Attempt to call before ARKodeInit.";
    iVar1 = -0x17;
  }
  else if (y0 == (N_Vector)0x0) {
    msgfmt = "y0 = NULL illegal.";
    iVar1 = -0x16;
  }
  else {
    ark_mem->tcur = t0;
    ark_mem->tn = t0;
    dVar2 = (double)(~-(ulong)(hscale < 0.0) & (ulong)hscale |
                    -(ulong)(hscale < 0.0) & 0x3ff0000000000000);
    if ((dVar2 != 1.0) || (NAN(dVar2))) {
      ark_mem->eta = dVar2;
      dVar2 = dVar2 * ark_mem->hprime;
      ark_mem->hprime = dVar2;
      if ((ark_mem->tstopset != 0) && (0.0 < ((dVar2 + t0) - ark_mem->tstop) * dVar2)) {
        dVar2 = (ark_mem->uround * -4.0 + 1.0) * (ark_mem->tstop - t0);
        ark_mem->hprime = dVar2;
        ark_mem->eta = dVar2 / ark_mem->h;
      }
    }
    local_38 = 0;
    local_34 = 0;
    if (y0->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
      N_VSpace(y0,&local_34,&local_38);
    }
    lrw_diff = local_34 - ark_mem->lrw1;
    liw_diff = local_38 - ark_mem->liw1;
    ark_mem->lrw1 = local_34;
    ark_mem->liw1 = local_38;
    iVar1 = arkResizeVectors(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0);
    if (iVar1 == 0) {
      msgfmt = "Unable to resize vector";
      iVar1 = -0x14;
    }
    else {
      if ((ark_mem->interp == (ARKInterp)0x0) ||
         (iVar1 = arkInterpResize(ark_mem,ark_mem->interp,resize,resize_data,lrw_diff,liw_diff,y0),
         iVar1 == 0)) {
        N_VScale(1.0,y0,ark_mem->yn);
        ark_mem->constraintsSet = 0;
        ark_mem->initsetup = 1;
        ark_mem->init_type = 2;
        ark_mem->firststage = 1;
        return 0;
      }
      msgfmt = "Interpolation module resize failure";
    }
  }
  arkProcessError(ark_mem,iVar1,"ARKode","arkResize",msgfmt);
  return iVar1;
}

Assistant:

int arkResize(ARKodeMem ark_mem, N_Vector y0, realtype hscale,
              realtype t0, ARKVecResizeFn resize, void *resize_data)
{
  booleantype resizeOK;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int retval;

  /* Check ark_mem */
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkResize", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode",
                    "arkResize", MSG_ARK_NO_MALLOC);
    return(ARK_NO_MALLOC);
  }

  /* Check for legal input parameters */
  if (y0 == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkResize", MSG_ARK_NULL_Y0);
    return(ARK_ILL_INPUT);
  }

  /* Copy the input parameters into ARKode state */
  ark_mem->tcur = t0;
  ark_mem->tn   = t0;

  /* Update time-stepping parameters */
  /*   adjust upcoming step size depending on hscale */
  if (hscale < ZERO)  hscale = ONE;
  if (hscale != ONE) {

    /* Encode hscale into ark_mem structure */
    ark_mem->eta = hscale;
    ark_mem->hprime *= hscale;

    /* If next step would overtake tstop, adjust stepsize */
    if ( ark_mem->tstopset )
      if ( (ark_mem->tcur + ark_mem->hprime - ark_mem->tstop)*ark_mem->hprime > ZERO ) {
        ark_mem->hprime = (ark_mem->tstop-ark_mem->tcur) *
          (ONE-FOUR*ark_mem->uround);
        ark_mem->eta = ark_mem->hprime/ark_mem->h;
      }

  }

  /* Determing change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL)
    N_VSpace(y0, &lrw1, &liw1);
  lrw_diff = lrw1 - ark_mem->lrw1;
  liw_diff = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* Resize the solver vectors (using y0 as a template) */
  resizeOK = arkResizeVectors(ark_mem, resize, resize_data,
                              lrw_diff, liw_diff, y0);
  if (!resizeOK) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkResize", "Unable to resize vector");
    return(ARK_MEM_FAIL);
  }

  /* Resize the interpolation structure memory */
  if (ark_mem->interp != NULL) {
    retval = arkInterpResize(ark_mem, ark_mem->interp, resize,
                             resize_data, lrw_diff, liw_diff, y0);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, retval, "ARKode", "arkResize",
                      "Interpolation module resize failure");
      return(retval);
    }
  }

  /* Copy y0 into ark_yn to set the current solution */
  N_VScale(ONE, y0, ark_mem->yn);

  /* Disable constraints */
  ark_mem->constraintsSet = SUNFALSE;

  /* Indicate that problem needs to be initialized */
  ark_mem->initsetup  = SUNTRUE;
  ark_mem->init_type  = RESIZE_INIT;
  ark_mem->firststage = SUNTRUE;

  /* Problem has been successfully re-sized */
  return(ARK_SUCCESS);
}